

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

SourceLocation __thiscall
slang::getMatchingMacroLoc
          (slang *this,SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_01;
  bool bVar1;
  SourceLocation SVar2;
  uint uVar3;
  undefined1 isStart_00;
  undefined7 in_register_00000081;
  BufferID *__first;
  size_type in_R9;
  SourceRange SVar4;
  SourceRange SVar5;
  BufferID local_34;
  
  __first = (BufferID *)CONCAT71(in_register_00000081,isStart);
  uVar3 = (uint)sm & 0xfffffff;
  if (uVar3 != (loc._0_4_ & 0xfffffff)) {
    bVar1 = SourceManager::isMacroLoc((SourceManager *)this,(SourceLocation)sm);
    if (bVar1) {
      bVar1 = SourceManager::isMacroArgLoc((SourceManager *)this,(SourceLocation)sm);
      if (bVar1) {
        local_34.id = uVar3;
        bVar1 = std::binary_search<slang::BufferID_const*,slang::BufferID>
                          (__first,__first + in_R9,&local_34);
        if (bVar1) {
          SVar2 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        }
        else {
          SVar2 = (SourceLocation)0x0;
        }
        SVar4.endLoc = SVar2;
        SVar4.startLoc = SVar2;
        SVar5 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
      }
      else {
        SVar4 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
        SVar2 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        SVar5.endLoc = SVar2;
        SVar5.startLoc = SVar2;
      }
      SVar2 = SVar4.endLoc;
      if (contextLoc._0_1_ != '\0') {
        SVar2 = SVar4.startLoc;
      }
      isStart_00 = SUB81(__first,0);
      if (((ulong)SVar2 & 0xfffffff) != 0) {
        commonArgs_00.size_ = in_R9;
        commonArgs_00.data_ = __first;
        SVar2 = getMatchingMacroLoc(this,(SourceManager *)SVar2,loc,
                                    (SourceLocation)((ulong)contextLoc & 0xff),(bool)isStart_00,
                                    commonArgs_00);
        isStart_00 = SUB81(__first,0);
        if (((ulong)SVar2 & 0xfffffff) != 0) {
          return SVar2;
        }
      }
      SVar2 = SVar5.endLoc;
      if (contextLoc._0_1_ != '\0') {
        SVar2 = SVar5.startLoc;
      }
      commonArgs_01.size_ = in_R9;
      commonArgs_01.data_ = __first;
      sm = (SourceManager *)
           getMatchingMacroLoc(this,(SourceManager *)SVar2,loc,
                               (SourceLocation)((ulong)contextLoc & 0xff),(bool)isStart_00,
                               commonArgs_01);
    }
    else {
      sm = (SourceManager *)0x0;
    }
  }
  return (SourceLocation)sm;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::binary_search(commonArgs.begin(), commonArgs.end(), loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}